

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  char cVar3;
  Primitive *pPVar4;
  double *pdVar5;
  long lVar6;
  int iVar7;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar8;
  double dVar9;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> geometry;
  Matrix3 res;
  Mat Normalmap;
  Mat Depthmap;
  Affine3d Tcam;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> local_588;
  double adStack_570 [18];
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  long *local_4d8 [2];
  long local_4c8 [2];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [24];
  Mat *local_490;
  Vector4f local_488;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined1 local_458 [16];
  double local_448;
  double dStack_440;
  double local_438;
  double dStack_430;
  double local_428;
  double dStack_420;
  double local_418;
  Mat local_3e8 [96];
  Mat local_388 [152];
  Mat local_2f0 [96];
  Mat local_290 [96];
  _InputArray local_230 [24];
  Affine3d local_218;
  long *local_190 [2];
  long local_180 [12];
  Mat local_120 [96];
  Mat aMStack_c0 [144];
  
  local_588.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_588.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_588.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  adStack_570[1] = 1.0;
  adStack_570[2] = 0.0;
  adStack_570[3] = 0.0;
  adStack_570[4] = 0.0;
  adStack_570[5] = 0.0;
  adStack_570[6] = 1.0;
  adStack_570[7] = 0.0;
  adStack_570[8] = 0.0;
  adStack_570[9] = 0.0;
  adStack_570[10] = 0.0;
  adStack_570[0xb] = 1.0;
  adStack_570[0xc] = 0.0;
  adStack_570[0xd] = 0.0;
  adStack_570[0xe] = 0.0;
  adStack_570[0xf] = -1.0;
  adStack_570[0x10] = 1.0;
  local_458._0_8_ = operator_new(0xb0);
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] = 1.0;
  ((Primitive *)local_458._0_8_)->_vptr_Primitive = (_func_int **)&PTR_signedDistance_001079b8;
  ((Primitive *)local_458._0_8_)->invert = true;
  ((Primitive *)local_458._0_8_)->operation = bool_union;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       adStack_570[1];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       adStack_570[2];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       adStack_570[3];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] =
       adStack_570[4];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       adStack_570[5];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       adStack_570[6];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] =
       adStack_570[7];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] =
       adStack_570[8];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] =
       adStack_570[9];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] =
       adStack_570[10];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] =
       adStack_570[0xb];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] =
       adStack_570[0xc];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] =
       adStack_570[0xf];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
       adStack_570[0x10];
  (((Primitive *)local_458._0_8_)->parameters).
  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] = 4.0;
  (((Primitive *)local_458._0_8_)->parameters).
  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] = 4.0;
  (((Primitive *)local_458._0_8_)->parameters).
  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] = 8.0;
  (((Primitive *)local_458._0_8_)->parameters).
  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] = 0.0;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&local_588,
             (Primitive **)local_458);
  adStack_570[1] = 1.0;
  adStack_570[2] = 0.0;
  adStack_570[3] = 0.0;
  adStack_570[4] = 0.0;
  adStack_570[5] = 0.0;
  adStack_570[6] = 1.0;
  adStack_570[9] = 0.0;
  adStack_570[10] = 0.0;
  adStack_570[7] = 0.0;
  adStack_570[8] = 0.0;
  adStack_570[0xb] = 1.0;
  adStack_570[0xc] = 0.0;
  adStack_570[0x10] = 1.0;
  adStack_570[0xd] = -1.0;
  adStack_570[0xe] = 1.0;
  adStack_570[0xf] = 2.2;
  pdVar5 = &local_448;
  local_448 = 0.49999999999999994;
  dStack_440 = 0.0;
  local_428 = -0.49999999999999994;
  dStack_420 = 0.0;
  local_458 = ZEXT816(0x3febb67ae8584cab);
  local_438 = 1.0;
  dStack_430 = 0.0;
  local_418 = 0.8660254037844387;
  lVar6 = 0x10;
  do {
    dVar1 = pdVar5[-1];
    *(double *)((long)adStack_570 + lVar6 + -8) = pdVar5[-2];
    *(double *)((long)adStack_570 + lVar6) = dVar1;
    *(double *)((long)adStack_570 + lVar6 + 8) = *pdVar5;
    lVar6 = lVar6 + 0x20;
    pdVar5 = pdVar5 + 3;
  } while (lVar6 != 0x70);
  pPVar4 = (Primitive *)operator_new(0xb0);
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[3] = 0.0;
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[7] = 0.0;
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xb] = 0.0;
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xf] = 1.0;
  pPVar4->_vptr_Primitive = (_func_int **)&PTR_signedDistance_001079b8;
  pPVar4->invert = false;
  pPVar4->operation = bool_union;
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0] = adStack_570[1];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[1] = adStack_570[2];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[2] = adStack_570[3];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[3] = adStack_570[4];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[4] = adStack_570[5];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[5] = adStack_570[6];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[6] = adStack_570[7];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[7] = adStack_570[8];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[8] = adStack_570[9];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[9] = adStack_570[10];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[10] = adStack_570[0xb];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xb] = adStack_570[0xc];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xc] = adStack_570[0xd];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xd] = adStack_570[0xe];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xe] = adStack_570[0xf];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xf] = adStack_570[0x10];
  (pPVar4->parameters).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[0] = 1.0;
  (pPVar4->parameters).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[1] = 2.0;
  (pPVar4->parameters).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[2] = 0.5;
  (pPVar4->parameters).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3] = 0.0;
  local_458._0_8_ = pPVar4;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&local_588,
             (Primitive **)local_458);
  adStack_570[1] = 1.0;
  adStack_570[2] = 0.0;
  adStack_570[3] = 0.0;
  adStack_570[4] = 0.0;
  adStack_570[5] = 0.0;
  adStack_570[6] = 1.0;
  adStack_570[9] = 0.0;
  adStack_570[10] = 0.0;
  adStack_570[7] = 0.0;
  adStack_570[8] = 0.0;
  adStack_570[0xb] = 1.0;
  adStack_570[0xc] = 0.0;
  adStack_570[0x11] = 0.0;
  uStack_4e0 = 0;
  uStack_4dc = 0x3ff00000;
  adStack_570[0x10] = 1.0;
  adStack_570[0xd] = 1.0;
  adStack_570[0xe] = 1.5;
  adStack_570[0xf] = 2.0;
  local_458._0_8_ = operator_new(0xb0);
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] = 1.0;
  ((Primitive *)local_458._0_8_)->_vptr_Primitive = (_func_int **)&PTR_signedDistance_00107a10;
  ((Primitive *)local_458._0_8_)->invert = false;
  ((Primitive *)local_458._0_8_)->operation = bool_union;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] = 1.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4] =
       adStack_570[0x11];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5] =
       (double)CONCAT44(uStack_4dc,uStack_4e0);
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[10] = 1.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xb] = 0.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xc] = 1.0;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xd] = 1.5;
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xe] =
       adStack_570[0xf];
  (((Primitive *)local_458._0_8_)->transformation).m_matrix.
  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
       adStack_570[0x10];
  (((Primitive *)local_458._0_8_)->parameters).
  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] = 0.5;
  (((Primitive *)local_458._0_8_)->parameters).
  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] = 0.0;
  (((Primitive *)local_458._0_8_)->parameters).
  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] = 0.0;
  (((Primitive *)local_458._0_8_)->parameters).
  super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] = 0.0;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&local_588,
             (Primitive **)local_458);
  adStack_570[1] = 1.0;
  adStack_570[2] = 0.0;
  adStack_570[3] = 0.0;
  adStack_570[4] = 0.0;
  adStack_570[5] = 0.0;
  adStack_570[6] = 1.0;
  adStack_570[9] = 0.0;
  adStack_570[10] = 0.0;
  adStack_570[7] = 0.0;
  adStack_570[8] = 0.0;
  adStack_570[0xb] = 1.0;
  adStack_570[0xc] = 0.0;
  adStack_570[0x10] = 1.0;
  adStack_570[0xd] = 0.5;
  adStack_570[0xe] = 1.4;
  adStack_570[0xf] = 0.5;
  pdVar5 = &local_448;
  local_448 = -0.17364817766693033;
  dStack_440 = 0.0;
  local_428 = 0.17364817766693033;
  dStack_420 = 0.0;
  local_458 = ZEXT816(0x3fef838b8c811c17);
  local_438 = 1.0;
  dStack_430 = 0.0;
  local_418 = 0.984807753012208;
  lVar6 = 0x10;
  do {
    dVar1 = pdVar5[-1];
    *(double *)((long)adStack_570 + lVar6 + -8) = pdVar5[-2];
    *(double *)((long)adStack_570 + lVar6) = dVar1;
    *(double *)((long)adStack_570 + lVar6 + 8) = *pdVar5;
    lVar6 = lVar6 + 0x20;
    pdVar5 = pdVar5 + 3;
  } while (lVar6 != 0x70);
  pPVar4 = (Primitive *)operator_new(0xb0);
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[3] = 0.0;
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[7] = 0.0;
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xb] = 0.0;
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xf] = 1.0;
  pPVar4->_vptr_Primitive = (_func_int **)&PTR_signedDistance_001079b8;
  pPVar4->invert = false;
  pPVar4->operation = bool_union;
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0] = adStack_570[1];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[1] = adStack_570[2];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[2] = adStack_570[3];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[3] = adStack_570[4];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[4] = adStack_570[5];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[5] = adStack_570[6];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[6] = adStack_570[7];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[7] = adStack_570[8];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[8] = adStack_570[9];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[9] = adStack_570[10];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[10] = adStack_570[0xb];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xb] = adStack_570[0xc];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xc] = adStack_570[0xd];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xd] = adStack_570[0xe];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xe] = adStack_570[0xf];
  (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
  m_storage.m_data.array[0xf] = adStack_570[0x10];
  (pPVar4->parameters).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[0] = 0.6;
  (pPVar4->parameters).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[1] = 0.6;
  (pPVar4->parameters).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[2] = 0.6;
  (pPVar4->parameters).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
  .array[3] = 0.0;
  local_458._0_8_ = pPVar4;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&local_588,
             (Primitive **)local_458);
  adStack_570[1] = 1.0;
  adStack_570[2] = 0.0;
  adStack_570[3] = 0.0;
  adStack_570[4] = 0.0;
  adStack_570[5] = 0.0;
  adStack_570[6] = 1.0;
  adStack_570[9] = 0.0;
  adStack_570[10] = 0.0;
  adStack_570[7] = 0.0;
  adStack_570[8] = 0.0;
  adStack_570[0xb] = 1.0;
  adStack_570[0xc] = 0.0;
  adStack_570[0x11] = 0.0;
  uStack_4e0 = 0;
  uStack_4dc = 0x3ff00000;
  adStack_570[0x10] = 1.0;
  adStack_570[0xd] = 0.5;
  adStack_570[0xe] = 0.0;
  adStack_570[0xf] = 2.25;
  local_458._0_8_ = operator_new(0xb0);
  *(undefined8 *)(local_458._0_8_ + 0x88) = 0x3ff0000000000000;
  *(undefined ***)local_458._0_8_ = &PTR_signedDistance_00107a40;
  *(undefined1 *)(local_458._0_8_ + 8) = 0;
  *(undefined4 *)(local_458._0_8_ + 0xc) = 0;
  *(undefined8 *)(local_458._0_8_ + 0x10) = 0x3ff0000000000000;
  *(undefined8 *)(local_458._0_8_ + 0x18) = 0;
  *(undefined8 *)(local_458._0_8_ + 0x20) = 0;
  *(undefined8 *)(local_458._0_8_ + 0x28) = 0;
  *(double *)(local_458._0_8_ + 0x30) = adStack_570[0x11];
  *(ulong *)(local_458._0_8_ + 0x38) = CONCAT44(uStack_4dc,uStack_4e0);
  *(undefined8 *)(local_458._0_8_ + 0x40) = 0;
  *(undefined8 *)(local_458._0_8_ + 0x48) = 0;
  *(undefined8 *)(local_458._0_8_ + 0x50) = 0;
  *(undefined8 *)(local_458._0_8_ + 0x58) = 0;
  *(undefined8 *)(local_458._0_8_ + 0x60) = 0x3ff0000000000000;
  *(undefined8 *)(local_458._0_8_ + 0x68) = 0;
  *(undefined8 *)(local_458._0_8_ + 0x70) = 0x3fe0000000000000;
  *(undefined8 *)(local_458._0_8_ + 0x78) = 0;
  *(double *)(local_458._0_8_ + 0x80) = adStack_570[0xf];
  *(double *)(local_458._0_8_ + 0x88) = adStack_570[0x10];
  *(undefined8 *)(local_458._0_8_ + 0x90) = 0x3fe0000000000000;
  *(undefined8 *)(local_458._0_8_ + 0x98) = 0x3fb999999999999a;
  *(undefined8 *)(local_458._0_8_ + 0xa0) = 0;
  *(undefined8 *)(local_458._0_8_ + 0xa8) = 0;
  std::vector<sdf::Primitive*,std::allocator<sdf::Primitive*>>::emplace_back<sdf::Primitive*>
            ((vector<sdf::Primitive*,std::allocator<sdf::Primitive*>> *)&local_588,
             (Primitive **)local_458);
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0] = 1.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[1] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[2] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[3] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[4] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[5] = 1.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[6] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[7] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[8] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[9] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[10] = 1.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0xb] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0xd] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0xe] = 0.0;
  local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
  array[0xf] = 1.0;
  local_488.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[0] =
       300.0;
  local_488.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[1] =
       300.0;
  local_488.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[2] =
       319.5;
  local_488.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       239.5;
  cv::Mat::Mat(local_290);
  cv::Mat::Mat(local_2f0);
  local_490 = aMStack_c0;
  iVar7 = -0x96;
  while( true ) {
    adStack_570[0x11] = (double)iVar7;
    dVar1 = (adStack_570[0x11] * 12.566370614359172) / 180.0;
    local_4b8._0_8_ = dVar1;
    dVar1 = cos(dVar1);
    local_4a8._8_4_ = extraout_XMM0_Dc;
    local_4a8._0_8_ = dVar1;
    local_4a8._12_4_ = extraout_XMM0_Dd;
    local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
    .array[0xd] = sin((double)local_4b8._0_8_);
    local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
    .array[0xd] = local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                  m_storage.m_data.array[0xd] * 0.6;
    local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
    .array[0xe] = adStack_570[0x11] * 0.01;
    local_218.m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
    .array[0xc] = (double)local_4a8._0_8_;
    adStack_570[0x11] = (adStack_570[0x11] * 3.141592653589793) / 50.0;
    dVar1 = sin(adStack_570[0x11]);
    local_4a8._8_4_ = SUB84(dVar1 * 0.0,0);
    local_4a8._0_8_ = dVar1 * 1.0;
    local_4a8._12_4_ = (int)((ulong)(dVar1 * 0.0) >> 0x20);
    local_4b8._8_4_ = extraout_XMM0_Dc_00;
    local_4b8._0_8_ = dVar1 * 0.0;
    local_4b8._12_4_ = extraout_XMM0_Dd_00;
    dVar1 = cos(adStack_570[0x11]);
    dVar2 = 1.0 - dVar1;
    dVar8 = dVar2 * 1.0 * 0.0;
    dVar9 = dVar2 * 0.0 * 0.0;
    local_448 = dVar8 - (double)local_4a8._8_8_;
    dStack_420 = dVar9 - (double)local_4a8._0_8_;
    dStack_430 = dVar9 + (double)local_4a8._0_8_;
    local_428 = dVar8 + (double)local_4a8._8_8_;
    local_458._8_4_ = SUB84(dVar8 + (double)local_4b8._0_8_,0);
    local_458._0_8_ = dVar2 * 1.0 + dVar1;
    local_458._12_4_ = (int)((ulong)(dVar8 + (double)local_4b8._0_8_) >> 0x20);
    dStack_440 = dVar8 - (double)local_4b8._0_8_;
    local_438 = dVar1 + dVar9;
    local_418 = dVar2 * 0.0 * 0.0 + dVar1;
    lVar6 = 0x10;
    pdVar5 = &local_448;
    do {
      dVar1 = pdVar5[-1];
      *(double *)((long)adStack_570 + lVar6 + -8) = pdVar5[-2];
      *(double *)((long)adStack_570 + lVar6) = dVar1;
      *(double *)((long)adStack_570 + lVar6 + 8) = *pdVar5;
      lVar6 = lVar6 + 0x20;
      pdVar5 = pdVar5 + 3;
    } while (lVar6 != 0x70);
    pPVar4 = local_588.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>.
             _M_impl.super__Vector_impl_data._M_start[4];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0] = adStack_570[1];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[1] = adStack_570[2];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[2] = adStack_570[3];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[3] = adStack_570[4];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[4] = adStack_570[5];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[5] = adStack_570[6];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[6] = adStack_570[7];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[7] = adStack_570[8];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[8] = adStack_570[9];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[9] = adStack_570[10];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[10] = adStack_570[0xb];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xb] = adStack_570[0xc];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xc] = adStack_570[0xd];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xd] = adStack_570[0xe];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xe] = adStack_570[0xf];
    (pPVar4->transformation).m_matrix.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
    m_storage.m_data.array[0xf] = adStack_570[0x10];
    sdf::RenderNormal(&local_218,0x1e0,0x280,&local_488,0x20,10.0,0.05,&local_588,local_2f0);
    local_4d8[0] = local_4c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d8,"Normals","");
    local_478 = 0x3fe0000000000000;
    uStack_470 = 0;
    local_468 = 0;
    uStack_460 = 0;
    cv::operator*((Mat *)local_190,0.5);
    cv::operator-((Scalar_ *)local_458,(MatExpr *)&local_478);
    cv::_InputArray::_InputArray(local_230,(MatExpr *)local_458);
    cv::imshow((string *)local_4d8,local_230);
    cv::Mat::~Mat(local_388);
    cv::Mat::~Mat(local_3e8);
    cv::Mat::~Mat((Mat *)&local_448);
    cv::Mat::~Mat(local_490);
    cv::Mat::~Mat(local_120);
    cv::Mat::~Mat((Mat *)local_180);
    if (local_4d8[0] != local_4c8) {
      operator_delete(local_4d8[0],local_4c8[0] + 1);
    }
    sdf::RenderDepth(&local_218,0x1e0,0x280,&local_488,0x20,10.0,0.4,0.05,&local_588,local_290);
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"Depth","");
    cv::operator/((Mat *)local_458,10.0);
    cv::_InputArray::_InputArray((_InputArray *)local_4d8,(MatExpr *)local_458);
    cv::imshow((string *)local_190,(_InputArray *)local_4d8);
    cv::Mat::~Mat(local_388);
    cv::Mat::~Mat(local_3e8);
    cv::Mat::~Mat((Mat *)&local_448);
    if (local_190[0] != local_180) {
      operator_delete(local_190[0],local_180[0] + 1);
    }
    cVar3 = cv::waitKey(2);
    if (((cVar3 == '\x1b') || (cVar3 == 'q')) || (cVar3 == 'G')) break;
    iVar7 = iVar7 + 1;
    if (iVar7 == 0x3c) {
      cv::waitKey(0);
      cv::Mat::~Mat(local_2f0);
      cv::Mat::~Mat(local_290);
      if (local_588.super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_588.
                        super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_588.
                              super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_588.
                              super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return 0;
    }
  }
  exit(0);
}

Assistant:

int main( int argc, char* argv[] )
{

//-----------------------------------------------------------------------------    
// Define geometry of the world
//-------------------------------------------------------------------------
    std::vector<sdf::Primitive*> geometry;
    Eigen::Vector4d geometryParam;

    // Create the room
    Eigen::Affine3d T = Eigen::Affine3d::Identity();
    T.translation() = Eigen::Vector3d(0.0, 0.0, -1.0);
    geometryParam << 4.0, 4.0, 8.0, 0.0; //dimensions in X Y Z
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , true)); //the last flag flips the sign of the box

    // Add a box inside
    T = Eigen::Affine3d::Identity();
    geometryParam << 1.0, 2.0, 0.5, 0.0; //dimensions in X Y Z
    T.translation() = Eigen::Vector3d(-1.0, 1.0, 2.2);
    T.linear() = (  Eigen::AngleAxisd(-M_PI*30/180, Eigen::Vector3d::UnitY())).toRotationMatrix(); 
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , false));
        
    //Add a Sphere
    T = Eigen::Affine3d::Identity();
    T.translation() = Eigen::Vector3d(1.0, 1.5, 2.0);
    geometryParam << 0.5, 0.0, 0.0, 0.0; // Radius
    geometry.push_back(new sdf::Sphere( sdf::bool_union, T, geometryParam , false));
    T = Eigen::Affine3d::Identity();
   
    //Add another Box
    geometryParam << 0.6, 0.6, 0.6, 0.0; //dimensions in X Y Z
    T.translation() = Eigen::Vector3d(0.5, 2-0.6, 0.5);
    T.linear() = (  Eigen::AngleAxisd(M_PI*10/180, Eigen::Vector3d::UnitY())).toRotationMatrix(); 
    geometry.push_back(new sdf::Box( sdf::bool_union, T, geometryParam , false));
    T = Eigen::Affine3d::Identity();

    //Add a torus
    T.translation() = Eigen::Vector3d(0.5, 0, 2.25);
    geometryParam << 0.50, 0.1, 0.0, 0.0; // radius of ring, radius of cross-section
    geometry.push_back(new sdf::Torus( sdf::bool_union, T, geometryParam , false));
//-----------------------------------------------------------------------------    
//Define a camera to use as sensor
//-----------------------------------------------------------------------------    
    Eigen::Affine3d Tcam = Eigen::Affine3d::Identity();

    float fx = 300;
    float fy = 300;
    float cx = 319.5;
    float cy = 239.5;

    // focalx,focaly,centerx,centery (image size is determined by Render() fcn )
    Eigen::Vector4f cam_params(fx, fy, cx, cy);

    cv::Mat Depthmap;
    cv::Mat Normalmap;

//-----------------------------------------------------------------------------    
//Do some rendering and animation
//-----------------------------------------------------------------------------    
    // A simple animation loop
      
    for (int i = -150; i < 60; ++i)
    {
      //time steps      
      double t = double(i);

      // move the camera in an elliptic 3D spiral with pure translation (X Y Z)
      Tcam.translation() = Eigen::Vector3d( 
          cos(4*M_PI*t/180), 
          0.6*sin(4*M_PI*t/180), 
          t*0.01);

      //change the rotation for one of the objects at each iteration
      T.linear() = ( 
                    //Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitZ()) *   
                    //Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitY()) * 
                    Eigen::AngleAxisd(i*M_PI/50, Eigen::Vector3d::UnitX()) 
                    ).toRotationMatrix(); //rotation about X 
      geometry[4]->transformation = T;

      
      //Render Normal-map from synthetic environment 
      sdf::RenderNormal(Tcam, 480, 640, cam_params, 32, 10, 0.05, geometry,Normalmap);
      cv::imshow("Normals", 0.5-Normalmap*0.5);
    
      //Render Depth image from synthetic environment     
      sdf::RenderDepth(Tcam, 480, 640, cam_params, 32, 10, 0.4, 0.05, geometry,Depthmap);      
      cv::imshow("Depth", Depthmap/10.0);
      char q = cv::waitKey(2);

    if(q == 'q' || q  == 27 || q  == 71 ) { exit(0); }

    }
    cv::waitKey();
   return 0;
}